

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-io.h
# Opt level: O2

void __thiscall
mp::SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>::HandleSolution
          (SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter> *this,
          int status,CStringRef message,double *values,double *dual_values,double param_5)

{
  StrictMockProblemBuilder *pSVar1;
  TestSolver *pTVar2;
  size_type sVar3;
  char *pcVar4;
  int iVar5;
  Result RVar6;
  long lVar7;
  bool bVar8;
  Argument1 gmock_a1;
  Argument1 gmock_a1_00;
  Argument1 gmock_a1_01;
  Argument1 gmock_a1_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> dir;
  string solFilePath;
  _Vector_base<double,_std::allocator<double>_> local_178;
  double *local_160;
  size_t sStack_158;
  _Vector_base<long,_std::allocator<long>_> local_148;
  long *local_130;
  size_t sStack_128;
  _Vector_base<double,_std::allocator<double>_> local_118;
  double *local_100;
  size_t local_f8;
  SolutionAdapter<StrictMockProblemBuilder> sol;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar8 = true;
  if ((this->solver_->super_Solver).super_BasicSolver.count_solutions_ == false) {
    bVar8 = (this->solver_->super_Solver).super_BasicSolver.solution_stub_._M_string_length != 0;
  }
  if ((values != (double *)0x0) && (bVar8)) {
    gmock_a1.size_ = 4;
    gmock_a1.data_ = "nsol";
    MockProblemBuilder::AddIntSuffix
              (&(this->builder_->super_StrictMock<MockProblemBuilder>).super_MockProblemBuilder,
               gmock_a1,0x53,0);
    gmock_a1_00.size_ = 4;
    gmock_a1_00.data_ = "nsol";
    MockProblemBuilder::AddIntSuffix
              (&(this->builder_->super_StrictMock<MockProblemBuilder>).super_MockProblemBuilder,
               gmock_a1_00,0x52,0);
    gmock_a1_01.size_ = 5;
    gmock_a1_01.data_ = "npool";
    MockProblemBuilder::AddIntSuffix
              (&(this->builder_->super_StrictMock<MockProblemBuilder>).super_MockProblemBuilder,
               gmock_a1_01,0x53,0);
    gmock_a1_02.size_ = 5;
    gmock_a1_02.data_ = "npool";
    MockProblemBuilder::AddIntSuffix
              (&(this->builder_->super_StrictMock<MockProblemBuilder>).super_MockProblemBuilder,
               gmock_a1_02,0x52,0);
  }
  pSVar1 = this->builder_;
  local_148._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  RVar6 = 0;
  local_148._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_130 = (this->options_).data_;
  sStack_128 = (this->options_).size_;
  iVar5 = 0;
  if (values != (double *)0x0) {
    iVar5 = MockProblemBuilder::num_vars
                      (&(pSVar1->super_StrictMock<MockProblemBuilder>).super_MockProblemBuilder);
  }
  sStack_158 = (size_t)iVar5;
  local_178._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_160 = values;
  if (dual_values != (double *)0x0) {
    RVar6 = MockProblemBuilder::num_algebraic_cons
                      (&(this->builder_->super_StrictMock<MockProblemBuilder>).
                        super_MockProblemBuilder);
  }
  local_f8 = (size_t)RVar6;
  local_118._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar2 = this->solver_;
  if (((pTVar2->super_Solver).super_BasicSolver.opts_read_ != true) ||
     (sol.objno_ = 0, (pTVar2->super_Solver).super_BasicSolver.obj_added_ == true)) {
    iVar5 = (pTVar2->super_Solver).super_BasicSolver.objno_;
    sol.objno_ = -iVar5;
    if (0 < iVar5) {
      sol.objno_ = iVar5;
    }
  }
  sol.options_.save_.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  sol.options_.save_.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  sol.options_.save_.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  sol.options_.data_ = local_130;
  sol.options_.size_ = sStack_128;
  sol.values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sol.values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sol.values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sol.values_.data_ = local_160;
  sol.values_.size_ = sStack_158;
  sol.dual_values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sol.dual_values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sol.dual_values_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_100 = dual_values;
  sol.status_ = status;
  sol.builder_ = pSVar1;
  sol.message_ = message.data_;
  sol.dual_values_.data_ = dual_values;
  sol.dual_values_.size_ = local_f8;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_118);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_178);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_148);
  solFilePath._M_dataplus._M_p = (pointer)&solFilePath.field_2;
  solFilePath._M_string_length = 0;
  solFilePath.field_2._M_local_buf[0] = '\0';
  sVar3 = (this->overrideStub_)._M_string_length;
  if (sVar3 == 0) {
    std::operator+(&dir,&this->stub_,".sol");
    std::__cxx11::string::operator=((string *)&solFilePath,(string *)&dir);
  }
  else {
    if ((sVar3 != 1) &&
       ((pcVar4 = (this->overrideStub_)._M_dataplus._M_p, *pcVar4 == '/' || (pcVar4[1] == ':')))) {
      std::__cxx11::string::_M_assign((string *)&solFilePath);
      goto LAB_0019a5a3;
    }
    lVar7 = std::__cxx11::string::find_last_of((char *)&this->stub_,0x1df4c1);
    if (lVar7 == -1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&dir,"",(allocator<char> *)&local_50);
    }
    else {
      std::__cxx11::string::substr((ulong)&dir,(ulong)&this->stub_);
    }
    std::operator+(&local_50,&dir,&this->overrideStub_);
    std::__cxx11::string::operator=((string *)&solFilePath,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::~string((string *)&dir);
LAB_0019a5a3:
  WriteSolFile<mp::SolutionAdapter<StrictMockProblemBuilder>>
            ((CStringRef)solFilePath._M_dataplus._M_p,&sol);
  std::__cxx11::string::~string((string *)&solFilePath);
  SolutionAdapter<StrictMockProblemBuilder>::~SolutionAdapter(&sol);
  return;
}

Assistant:

void SolutionWriterImpl<Solver, PB, Writer>::HandleSolution(
    int status, fmt::CStringRef message, const double *values,
    const double *dual_values, double) {
	if (solver_.need_multiple_solutions()
			&& values) {             // not when reporting an error
    auto kindP = mp::suf::Kind( suf::PROBLEM | suf::OUTPUT | suf::OUTONLY );
    auto kindO = mp::suf::Kind( suf::OBJ | suf::OUTPUT | suf::OUTONLY );
    builder_.AddIntSuffix("nsol", kindP, 0).
        SetValue(0, num_solutions_);
    builder_.AddIntSuffix("nsol", kindO, 0).
        SetValue(0, num_solutions_);
    builder_.AddIntSuffix("npool", kindP, 0).
        SetValue(0, num_solutions_);
    builder_.AddIntSuffix("npool", kindO, 0).
        SetValue(0, num_solutions_);
  }
  SolutionAdapter<PB> sol(
        status, &builder_, message.c_str(), options_,
        MakeArrayRef(values, values ? builder_.num_vars() : 0),
        MakeArrayRef(dual_values,
                     dual_values ? builder_.num_algebraic_cons() : 0),
        solver_.objno_used());

  std::string solFilePath;
  if (!overrideStub_.empty()) { 
    // Check if its absolute or relative
    if ((overrideStub_.length() >= 2) &&// cannot be absolute otherwise 
       ((overrideStub_[0] == '/') || // linux abs (/ ...)
        (overrideStub_[1] == ':') ))  {// windows abs (x: ///)
        solFilePath = overrideStub_; // if absolute
    }
    else { // if relative
      size_t pos = stub_.find_last_of("\\/"); //.find parent dir
      auto dir = (std::string::npos == pos) ? "" : stub_.substr(0, pos+1);
      solFilePath = dir + overrideStub_;
    }
  }
  else { solFilePath = stub_ + ".sol"; }
  
  this->Write(solFilePath, sol);
}